

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditDelibsTests.cpp
# Opt level: O3

int __thiscall dit::DebaseTests::init(DebaseTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"int32",
             "deInt32_selfTest()");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0026fd78;
  pTVar1[1]._vptr_TestNode = (_func_int **)deInt32_selfTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"float16",
             "deFloat16_selfTest()");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0026fd78;
  pTVar1[1]._vptr_TestNode = (_func_int **)deFloat16_selfTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"math",
             "deMath_selfTest()");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0026fd78;
  pTVar1[1]._vptr_TestNode = (_func_int **)deMath_selfTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"sha1",
             "deSha1_selfTest()");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0026fd78;
  pTVar1[1]._vptr_TestNode = (_func_int **)deSha1_selfTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"memory",
             "deMemory_selfTest()");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0026fd78;
  pTVar1[1]._vptr_TestNode = (_func_int **)deMemory_selfTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		addChild(new SelfCheckCase(m_testCtx, "int32",		"deInt32_selfTest()",	deInt32_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "float16",	"deFloat16_selfTest()",	deFloat16_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "math",		"deMath_selfTest()",	deMath_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "sha1",		"deSha1_selfTest()",	deSha1_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "memory",		"deMemory_selfTest()",	deMemory_selfTest));
	}